

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall
kratos::FSM::generate_output
          (FSM *this,Enum *enum_def,EnumVar *current_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  Enum *this_00;
  ulong uVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  ulong uVar3;
  pointer ppVVar4;
  mapped_type pVVar5;
  mapped_type var;
  Generator *this_01;
  element_type *this_02;
  undefined1 auVar6 [8];
  pointer ppFVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  pointer psVar8;
  undefined8 this_04;
  pointer ppFVar9;
  key_type pFVar10;
  const_iterator cVar11;
  mapped_type *ppVVar12;
  iterator iVar13;
  pointer ppVVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer *this_05;
  key_type *__k;
  Var *pVVar15;
  string_view format_str;
  format_args args;
  undefined1 local_168 [8];
  shared_ptr<kratos::CombinationalStmtBlock> output_comb;
  _Alloc_hider local_140;
  shared_ptr<kratos::SwitchStmt> output_case_comb;
  undefined8 local_128;
  undefined1 auStack_118 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::AssignStmt> stmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  undefined1 auStack_98 [8];
  string state_name;
  Var *iter;
  key_type local_40;
  FSMState *state;
  
  state = (FSMState *)this;
  Generator::combinational((Generator *)local_168);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (state_name.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  this_00 = (Enum *)(&state_name.field_2._M_allocated_capacity + 1);
  std::__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::SwitchStmt>,std::shared_ptr<kratos::Var>>
            ((__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2> *)&local_140,
             (allocator<kratos::SwitchStmt> *)auStack_98,(shared_ptr<kratos::Var> *)this_00);
  if (iter != (Var *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_d0,
             (FSM *)state,false);
  uVar3 = (enum_def->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar1 = uVar3 - 1;
  this_02 = output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar6 = local_d0;
  ppFVar7 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 ^ uVar1) <= uVar1) {
    state_name.field_2._8_8_ = 0;
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
      _M_realloc_insert<decltype(nullptr)>
                ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)local_d0,
                 (iterator)
                 states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(void **)((long)&state_name.field_2 + 8));
      this_02 = output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      auVar6 = local_d0;
      ppFVar7 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
       super__Vector_impl_data._M_start = (FSMState *)0x0;
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      ppFVar7 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
  }
  do {
    ppFVar9 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_02;
    if (auVar6 == (undefined1  [8])
                  states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      if (this_02 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar2 = &(this_02->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar2->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar2->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar2 = &(this_02->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar2->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar2->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar7;
      StmtBlock::add_stmt((StmtBlock *)local_168,
                          (shared_ptr<kratos::Stmt> *)((long)&state_name.field_2 + 8));
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      if (local_d0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_d0,
                        (long)states.
                              super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_d0);
      }
      if (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   output_case_comb.
                   super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   output_comb.
                   super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return;
    }
    this_05 = &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_40 = (key_type)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar6)->_vptr__Sp_counted_base;
    auStack_98 = (undefined1  [8])&state_name._M_string_length;
    state_name._M_dataplus._M_p = (pointer)0x0;
    state_name._M_string_length._0_1_ = 0;
    if (local_40 == (key_type)0x0) {
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar7;
      std::__cxx11::string::_M_replace((ulong)auStack_98,0,(char *)0x0,0x242044);
      local_40 = (key_type)(state->next_state_fn_ln_)._M_h._M_single_bucket;
      pVVar15 = (Var *)0x0;
      local_128 = 0;
    }
    else {
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar7;
      cVar11 = std::
               _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&state_name_mapping->_M_h,&local_40);
      if (cVar11.
          super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      std::__cxx11::string::_M_assign((string *)auStack_98);
      Enum::get_enum(this_00,(string *)enum_def);
      local_128 = state_name.field_2._8_8_;
      pVVar15 = iter;
    }
    pFVar10 = local_40;
    auStack_118 = (undefined1  [8])0x0;
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    reserve((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)auStack_118,
            (local_40->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar6;
    output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar15;
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)this_05,
               (pFVar10->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ppVVar4 = (pFVar10->output_ordering_).
              super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar14 = (pFVar10->output_ordering_).
                    super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppVVar14 != ppVVar4; ppVVar14 = ppVVar14 + 1)
    {
      state_name.field_2._8_8_ = *ppVVar14;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)this_05,(Var **)this_00);
    }
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      __k = (key_type *)
            states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        ppVVar12 = std::
                   map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                   ::at(&pFVar10->output_values_,__k);
        pVVar5 = *ppVVar12;
        var = *__k;
        if (pVVar5 != var && pVVar5 != (mapped_type)0x0) {
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this_00,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &pVVar5->super_enable_shared_from_this<kratos::Var>);
          Var::assign((Var *)&stmts.
                              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (shared_ptr<kratos::Var> *)var);
          if (iter != (Var *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
          }
          if (*(char *)((state->name_).field_2._M_allocated_capacity + 0xbc) == '\x01') {
            state_name.field_2._8_8_ = 0;
            iter = (Var *)(local_40->output_fn_ln_)._M_h._M_bucket_count;
            local_e0._M_allocated_capacity = (size_type)this_00;
            std::
            _Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign<std::_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,false>>>>
                      ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,&(local_40->output_fn_ln_)._M_h,
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>_>_>
                        *)&local_e0._M_allocated_capacity);
            iVar13 = std::
                     _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this_00,__k);
            psVar8 = stmts.
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (iVar13.
                super__Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
                ._M_cur != (__node_type *)0x0) {
              iVar13 = std::
                       _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)this_00,__k);
              if (iVar13.
                  super__Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              std::
              vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                        ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                          *)&(psVar8->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)((long)iVar13.
                                   super__Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
                                   ._M_cur + 0x10));
            }
            std::
            _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this_00);
          }
          std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
          emplace_back<std::shared_ptr<kratos::AssignStmt>&>
                    ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                      *)auStack_118,
                     (shared_ptr<kratos::AssignStmt> *)
                     &stmts.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
        __k = __k + 1;
      } while (__k != (key_type *)0x0);
    }
    this_03._M_pi =
         output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (auStack_118 !=
        (undefined1  [8])
        stmts.
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      state_name.field_2._8_8_ = local_128;
      if (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SwitchStmt::add_switch_case
                ((SwitchStmt *)local_140._M_p,(shared_ptr<kratos::Const> *)this_00,
                 (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)auStack_118);
      if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
      }
      this_01 = (Generator *)(state->name_).field_2._M_allocated_capacity;
      state_name.field_2._8_8_ =
           (state->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
           super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0xe;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)this_00;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)"{0}_{1}_Output",
                 format_str,args);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)&local_e0);
      this_04 = local_e0._8_8_;
      state_name.field_2._8_8_ = local_e0._M_allocated_capacity;
      iter = (Var *)local_e0._8_8_;
      local_e0._M_allocated_capacity = 0;
      local_e0._8_8_ = (Var *)0x0;
      Generator::add_named_block
                (this_01,(string *)
                         &stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (shared_ptr<kratos::StmtBlock> *)this_00);
      if ((Var *)this_04 != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04);
      }
      if ((Var *)local_e0._8_8_ != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
      }
      if (stmts.
          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount) {
        operator_delete(stmts.
                        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)((long)&(stmt.
                                        super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
    }
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(states.
                      super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      -(long)states.
                             super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)auStack_118);
    if (auStack_98 != (undefined1  [8])&state_name._M_string_length) {
      operator_delete((void *)auStack_98,
                      CONCAT71(state_name._M_string_length._1_7_,
                               (undefined1)state_name._M_string_length) + 1);
    }
    if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
    }
    this_02 = output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar6 = (undefined1  [8])
             &(output_comb.
               super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count;
    ppFVar7 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppFVar9;
  } while( true );
}

Assistant:

void FSM::generate_output(Enum& enum_def, EnumVar& current_state,
                          const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto output_comb = generator_->combinational();
    auto output_case_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    // need to deal with fully specified case where default is the same as start state
    // also default case
    if (!is_2_power(enum_def.values.size())) {
        states.emplace_back(nullptr);
    }

    for (auto* state : states) {
        std::shared_ptr<EnumConst> state_enum;
        std::string state_name;
        if (state) {
            state_name = state_name_mapping.at(state);
            state_enum = enum_def.get_enum(state_name);
        } else {
            state_name = "default";
            state_enum = nullptr;
            // use default state outputs
            state = start_state_.get();
        }

        std::vector<std::shared_ptr<Stmt>> stmts;
        auto const& output_values = state->output_values();
        auto const& output_ordering = state->output_ordering();
        stmts.reserve(output_values.size());
        // sort the names
        std::vector<Var*> vars;
        vars.reserve(output_values.size());
        for (auto* iter : output_ordering) vars.emplace_back(iter);
        for (auto const& output_var : vars) {
            auto* value = output_values.at(output_var);
            if (value && value != output_var) {
                // value can be a nullptr
                // users may use the same variable to indicate not changed
                auto stmt = output_var->assign(value->shared_from_this());
                if (generator_->debug) {
                    auto debug_info = state->output_fn_ln();
                    if (debug_info.find(output_var) != debug_info.end())
                        stmt->fn_name_ln.emplace_back(debug_info.at(output_var));
                }
                stmts.emplace_back(stmt);
            }
        }
        // add it to the case
        if (!stmts.empty()) {
            auto& case_stmt = output_case_comb->add_switch_case(state_enum, stmts);
            generator_->add_named_block(::format("{0}_{1}_Output", fsm_name_, state_name),
                                        case_stmt.as<ScopedStmtBlock>());
        }
    }

    // add it to the output_comb
    output_comb->add_stmt(output_case_comb);
}